

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O0

EStatusCode __thiscall
AbstractContentContext::WriteTextCommandWithEncoding
          (AbstractContentContext *this,string *inUnicodeText,ITextCommand *inTextCommand)

{
  EStatusCode EVar1;
  undefined1 local_38 [8];
  GlyphUnicodeMappingList glyphsAndUnicode;
  ITextCommand *inTextCommand_local;
  string *inUnicodeText_local;
  AbstractContentContext *this_local;
  
  glyphsAndUnicode.super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>.
  _M_impl._M_node._M_size = (size_t)inTextCommand;
  std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::list
            ((list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> *)local_38);
  EncodeWithCurrentFont
            (this,inUnicodeText,
             (list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> *)local_38);
  EVar1 = WriteTextCommandWithDirectGlyphSelection
                    (this,(GlyphUnicodeMappingList *)local_38,
                     (ITextCommand *)
                     glyphsAndUnicode.
                     super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>.
                     _M_impl._M_node._M_size);
  std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::~list
            ((list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> *)local_38);
  return EVar1;
}

Assistant:

EStatusCode AbstractContentContext::WriteTextCommandWithEncoding(const std::string& inUnicodeText,ITextCommand* inTextCommand)
{
	GlyphUnicodeMappingList glyphsAndUnicode;
	EncodeWithCurrentFont(inUnicodeText, glyphsAndUnicode);

	return WriteTextCommandWithDirectGlyphSelection(glyphsAndUnicode,inTextCommand);
}